

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_mesh_vbuf::transform_points
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_80 [4];
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  double local_38;
  double local_30;
  double local_20;
  double local_18 [3];
  
  lVar1 = 0xf;
  do {
    local_80[lVar1] = (double)(xform->field_0).__array[lVar1];
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  if (size != 0) {
    lVar1 = 0;
    do {
      dVar5 = (double)*(float *)((long)&source->field_0 + lVar1);
      dVar4 = (double)*(float *)((long)&source->field_0 + lVar1 + 4);
      dVar3 = (double)*(float *)((long)&source->field_0 + lVar1 + 8);
      *(float *)((long)&target->field_0 + lVar1) =
           (float)(local_40 * dVar3 + local_60 * dVar4 + local_80[0] * dVar5 + local_20);
      *(float *)((long)&target->field_0 + lVar1 + 4) =
           (float)(local_38 * dVar3 + local_58 * dVar4 + local_80[1] * dVar5 + local_18[0]);
      *(float *)((long)&target->field_0 + lVar1 + 8) =
           (float)(dVar3 * local_30 + dVar4 * local_50 + dVar5 * local_80[2] + local_18[1]);
      lVar1 = lVar1 + 0xc;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_points(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).transform(m));
}